

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::FBXConverter
          (FBXConverter *this,aiScene *out,Document *doc,bool removeEmptyBones)

{
  bool bVar1;
  ImportSettings *pIVar2;
  ObjectMap *this_00;
  Material *local_110;
  _Self local_78;
  _Self local_70;
  Material *local_68;
  Material *mat;
  Object *ob;
  value_type *v;
  const_iterator __end3;
  const_iterator __begin3;
  ObjectMap *__range3;
  bool removeEmptyBones_local;
  Document *doc_local;
  aiScene *out_local;
  FBXConverter *this_local;
  
  this->defaultMaterialIndex = 0;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(&this->meshes);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector(&this->materials);
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::vector(&this->animations);
  (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::vector(&this->lights);
  (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::vector(&this->cameras);
  (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::vector(&this->textures);
  (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->materials_converted)._M_t._M_impl = 0;
  *(undefined8 *)&(this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
  ::map(&this->materials_converted);
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->textures_converted)._M_t._M_impl = 0;
  *(undefined8 *)&(this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
  ::map(&this->textures_converted);
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->meshes_converted)._M_t._M_impl = 0;
  *(undefined8 *)&(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::map(&this->meshes_converted);
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
  ;
  *(undefined8 *)&(this->node_anim_chain_bits)._M_t._M_impl = 0;
  *(undefined8 *)&(this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->node_anim_chain_bits);
  *(undefined8 *)&(this->mNodeNames)._M_h._M_rehash_policy = 0;
  (this->mNodeNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mNodeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mNodeNames)._M_h._M_element_count = 0;
  (this->mNodeNames)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->mNodeNames)._M_h._M_bucket_count = 0;
  (this->mNodeNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map(&this->mNodeNames);
  this->anim_fps = 0.0;
  this->out = out;
  this->doc = doc;
  ConvertAnimations(this);
  ConvertRootNode(this);
  pIVar2 = Document::Settings(doc);
  if ((pIVar2->readAllMaterials & 1U) != 0) {
    this_00 = Document::Objects(doc);
    __end3 = std::
             map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
             ::begin(this_00);
    v = (value_type *)
        std::
        map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
        ::end(this_00);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&v), bVar1) {
      ob = (Object *)
           std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>
           ::operator*(&__end3);
      mat = (Material *)LazyObject::Get((LazyObject *)ob->element,false);
      if (mat != (Material *)0x0) {
        if (mat == (Material *)0x0) {
          local_110 = (Material *)0x0;
        }
        else {
          local_110 = (Material *)__dynamic_cast(mat,&Object::typeinfo,&Material::typeinfo,0);
        }
        local_68 = local_110;
        if (local_110 != (Material *)0x0) {
          local_70._M_node =
               (_Base_ptr)
               std::
               map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
               ::find(&this->materials_converted,&local_68);
          local_78._M_node =
               (_Base_ptr)
               std::
               map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
               ::end(&this->materials_converted);
          bVar1 = std::operator==(&local_70,&local_78);
          if (bVar1) {
            ConvertMaterial(this,local_68,(MeshGeometry *)0x0);
          }
        }
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>::
      operator++(&__end3);
    }
  }
  ConvertGlobalSettings(this);
  TransferDataToScene(this);
  if (out->mNumMeshes == 0) {
    out->mFlags = out->mFlags | 1;
  }
  return;
}

Assistant:

FBXConverter::FBXConverter(aiScene* out, const Document& doc, bool removeEmptyBones )
        : defaultMaterialIndex()
        , lights()
        , cameras()
        , textures()
        , materials_converted()
        , textures_converted()
        , meshes_converted()
        , node_anim_chain_bits()
        , mNodeNames()
        , anim_fps()
        , out(out)
        , doc(doc) {
            // animations need to be converted first since this will
            // populate the node_anim_chain_bits map, which is needed
            // to determine which nodes need to be generated.
            ConvertAnimations();
            ConvertRootNode();

            if (doc.Settings().readAllMaterials) {
                // unfortunately this means we have to evaluate all objects
                for (const ObjectMap::value_type& v : doc.Objects()) {

                    const Object* ob = v.second->Get();
                    if (!ob) {
                        continue;
                    }

                    const Material* mat = dynamic_cast<const Material*>(ob);
                    if (mat) {

                        if (materials_converted.find(mat) == materials_converted.end()) {
                            ConvertMaterial(*mat, 0);
                        }
                    }
                }
            }

            ConvertGlobalSettings();
            TransferDataToScene();

            // if we didn't read any meshes set the AI_SCENE_FLAGS_INCOMPLETE
            // to make sure the scene passes assimp's validation. FBX files
            // need not contain geometry (i.e. camera animations, raw armatures).
            if (out->mNumMeshes == 0) {
                out->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
            }
        }